

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O0

Matrix4f * Matrix4f::lookAt(Vector3f *eye,Vector3f *center,Vector3f *up)

{
  Matrix4f *in_RDI;
  Vector3f x;
  Vector3f y;
  Vector3f z;
  Matrix4f *view;
  Vector3f *in_stack_ffffffffffffff58;
  Matrix4f *v1;
  Matrix4f *in_stack_ffffffffffffff70;
  Vector3f *in_stack_ffffffffffffff78;
  Vector3f *in_stack_ffffffffffffff80;
  Vector3f *in_stack_ffffffffffffff88;
  Vector3f *in_stack_ffffffffffffff90;
  Vector3f *in_stack_ffffffffffffff98;
  
  v1 = in_RDI;
  ::operator-(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  Vector3f::normalized(in_stack_ffffffffffffff78);
  Vector3f::Vector3f((Vector3f *)in_RDI,in_stack_ffffffffffffff58);
  Vector3f::cross(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  Matrix4f(in_RDI,0.0);
  Vector3f::dot((Vector3f *)in_stack_ffffffffffffff70,(Vector3f *)v1);
  Vector4f::Vector4f((Vector4f *)in_stack_ffffffffffffff70,(Vector3f *)v1,
                     (float)((ulong)in_RDI >> 0x20));
  setRow(in_stack_ffffffffffffff70,(int)((ulong)v1 >> 0x20),(Vector4f *)in_RDI);
  Vector3f::dot((Vector3f *)in_stack_ffffffffffffff70,(Vector3f *)v1);
  Vector4f::Vector4f((Vector4f *)in_stack_ffffffffffffff70,(Vector3f *)v1,
                     (float)((ulong)in_RDI >> 0x20));
  setRow(in_stack_ffffffffffffff70,(int)((ulong)v1 >> 0x20),(Vector4f *)in_RDI);
  Vector3f::dot((Vector3f *)in_stack_ffffffffffffff70,(Vector3f *)v1);
  Vector4f::Vector4f((Vector4f *)in_stack_ffffffffffffff70,(Vector3f *)v1,
                     (float)((ulong)in_RDI >> 0x20));
  setRow(in_stack_ffffffffffffff70,(int)((ulong)v1 >> 0x20),(Vector4f *)in_RDI);
  Vector4f::Vector4f((Vector4f *)&stack0xffffffffffffff70,0.0,0.0,0.0,1.0);
  setRow(in_stack_ffffffffffffff70,(int)((ulong)v1 >> 0x20),(Vector4f *)in_RDI);
  return v1;
}

Assistant:

Matrix4f Matrix4f::lookAt( const Vector3f& eye, const Vector3f& center, const Vector3f& up )
{
	// z is negative forward
	Vector3f z = ( eye - center ).normalized();
	Vector3f y = up;
	Vector3f x = Vector3f::cross( y, z );

	// the x, y, and z vectors define the orthonormal coordinate system
	// the affine part defines the overall translation
	Matrix4f view;

	view.setRow( 0, Vector4f( x, -Vector3f::dot( x, eye ) ) );
	view.setRow( 1, Vector4f( y, -Vector3f::dot( y, eye ) ) );
	view.setRow( 2, Vector4f( z, -Vector3f::dot( z, eye ) ) );
	view.setRow( 3, Vector4f( 0, 0, 0, 1 ) );

	return view;
}